

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

robin_iterator<false> * __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>,_tsl::robin_map<const_void_*,_(anonymous_namespace)::WeakRef_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_(anonymous_namespace)::malloc_allocator<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>_>,_false,_tsl::rh::prime_growth_policy>::KeySelect,_tsl::robin_map<const_void_*,_(anonymous_namespace)::WeakRef_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_(anonymous_namespace)::malloc_allocator<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>_>,_false,_tsl::rh::prime_growth_policy>::ValueSelect,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_(anonymous_namespace)::malloc_allocator<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>_>,_false,_tsl::rh::prime_growth_policy>
::robin_iterator<false>::operator++(robin_iterator<false> *this)

{
  bool bVar1;
  robin_iterator<false> *this_local;
  
  do {
    bVar1 = bucket_entry<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>,_false>::
            last_bucket(this->m_bucket);
    if (bVar1) {
      this->m_bucket = this->m_bucket + 1;
      return this;
    }
    this->m_bucket = this->m_bucket + 1;
    bVar1 = bucket_entry<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>,_false>::empty
                      (this->m_bucket);
  } while (bVar1);
  return this;
}

Assistant:

robin_iterator& operator++() {
      while (true) {
        if (m_bucket->last_bucket()) {
          ++m_bucket;
          return *this;
        }

        ++m_bucket;
        if (!m_bucket->empty()) {
          return *this;
        }
      }
    }